

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8_regexp.cc
# Opt level: O2

RegExp * re2c::UTF8Symbol(rune r)

{
  uint32_t uVar1;
  CatOp *this;
  Range *pRVar2;
  CatOp *this_00;
  MatchOp *this_01;
  ulong uVar3;
  uint32_t chars [4];
  
  uVar1 = utf8::rune_to_bytes(chars,r);
  this = (CatOp *)operator_new(0x10);
  pRVar2 = Range::sym(chars[0]);
  MatchOp::MatchOp((MatchOp *)this,pRVar2);
  for (uVar3 = 1; uVar3 < uVar1; uVar3 = uVar3 + 1) {
    this_00 = (CatOp *)operator_new(0x18);
    this_01 = (MatchOp *)operator_new(0x10);
    pRVar2 = Range::sym(chars[uVar3]);
    MatchOp::MatchOp(this_01,pRVar2);
    CatOp::CatOp(this_00,&this->super_RegExp,(RegExp *)this_01);
    this = this_00;
  }
  return &this->super_RegExp;
}

Assistant:

RegExp * UTF8Symbol(utf8::rune r)
{
	uint32_t chars[utf8::MAX_RUNE_LENGTH];
	const uint32_t chars_count = utf8::rune_to_bytes(chars, r);
	RegExp * re = new MatchOp(Range::sym (chars[0]));
	for (uint32_t i = 1; i < chars_count; ++i)
		re = new CatOp(re, new MatchOp(Range::sym (chars[i])));
	return re;
}